

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O3

bool __thiscall MT32Emu::BReverbModelImpl<short>::isActive(BReverbModelImpl<short> *this)

{
  Bit32u BVar1;
  short *psVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  iVar3 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar3 != '\0') {
    uVar4 = (ulong)this->currentSettings->numberOfAllpasses;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        psVar2 = (this->allpasses[uVar5]->super_RingBuffer<short>).buffer;
        if ((psVar2 != (short *)0x0) &&
           (BVar1 = (this->allpasses[uVar5]->super_RingBuffer<short>).size, BVar1 != 0)) {
          lVar6 = 0;
          do {
            if (0x10 < (ushort)(psVar2[lVar6] + 8U)) {
              return true;
            }
            lVar6 = lVar6 + 1;
          } while (BVar1 != (Bit32u)lVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar4);
    }
    uVar4 = (ulong)this->currentSettings->numberOfCombs;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        psVar2 = (this->combs[uVar5]->super_RingBuffer<short>).buffer;
        if ((psVar2 != (short *)0x0) &&
           (BVar1 = (this->combs[uVar5]->super_RingBuffer<short>).size, BVar1 != 0)) {
          lVar6 = 0;
          do {
            if (0x10 < (ushort)(psVar2[lVar6] + 8U)) {
              return true;
            }
            lVar6 = lVar6 + 1;
          } while (BVar1 != (Bit32u)lVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar4);
      return false;
    }
  }
  return false;
}

Assistant:

bool isActive() const {
		if (!isOpen()) return false;
		for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
			if (!allpasses[i]->isEmpty()) return true;
		}
		for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
			if (!combs[i]->isEmpty()) return true;
		}
		return false;
	}